

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_shift_tail(roaring_array_t *ra,int32_t count,int32_t distance)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int32_t in_ESI;
  roaring_array_t *in_RDI;
  int32_t dstpos;
  int32_t srcpos;
  
  if (0 < in_EDX) {
    extend_array(in_RDI,in_ESI);
  }
  iVar1 = in_RDI->size - in_ESI;
  iVar2 = iVar1 + in_EDX;
  memmove(in_RDI->keys + iVar2,in_RDI->keys + iVar1,(long)in_ESI << 1);
  memmove(in_RDI->containers + iVar2,in_RDI->containers + iVar1,(long)in_ESI << 3);
  memmove(in_RDI->typecodes + iVar2,in_RDI->typecodes + iVar1,(long)in_ESI);
  in_RDI->size = in_EDX + in_RDI->size;
  return;
}

Assistant:

void ra_shift_tail(roaring_array_t *ra, int32_t count, int32_t distance) {
    if (distance > 0) {
        extend_array(ra, distance);
    }
    int32_t srcpos = ra->size - count;
    int32_t dstpos = srcpos + distance;
    memmove(&(ra->keys[dstpos]), &(ra->keys[srcpos]), sizeof(uint16_t) * count);
    memmove(&(ra->containers[dstpos]), &(ra->containers[srcpos]),
            sizeof(container_t *) * count);
    memmove(&(ra->typecodes[dstpos]), &(ra->typecodes[srcpos]),
            sizeof(uint8_t) * count);
    ra->size += distance;
}